

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_group_get_scroll(nk_context *ctx,char *id,nk_uint *x_offset,nk_uint *y_offset)

{
  nk_window *win_00;
  int len;
  nk_hash name;
  nk_uint *local_48;
  nk_uint *y_offset_ptr;
  nk_uint *x_offset_ptr;
  nk_window *win;
  nk_hash id_hash;
  int id_len;
  nk_uint *y_offset_local;
  nk_uint *x_offset_local;
  char *id_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49ac,
                  "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                 );
  }
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49ad,
                  "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49ae,
                  "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49af,
                  "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                 );
  }
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) && (id != (char *)0x0)) {
    win_00 = ctx->current;
    len = nk_strlen(id);
    name = nk_murmur_hash(id,len,2);
    y_offset_ptr = nk_find_value(win_00,name);
    if (y_offset_ptr == (nk_uint *)0x0) {
      y_offset_ptr = nk_add_value(ctx,win_00,name,0);
      local_48 = nk_add_value(ctx,win_00,name + 1,0);
      if (y_offset_ptr == (nk_uint *)0x0) {
        __assert_fail("x_offset_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x49bc,
                      "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                     );
      }
      if (local_48 == (nk_uint *)0x0) {
        __assert_fail("y_offset_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x49bd,
                      "void nk_group_get_scroll(struct nk_context *, const char *, nk_uint *, nk_uint *)"
                     );
      }
      if (y_offset_ptr == (nk_uint *)0x0) {
        return;
      }
      if (local_48 == (nk_uint *)0x0) {
        return;
      }
      *local_48 = 0;
      *y_offset_ptr = 0;
    }
    else {
      local_48 = nk_find_value(win_00,name + 1);
    }
    if (x_offset != (nk_uint *)0x0) {
      *x_offset = *y_offset_ptr;
    }
    if (y_offset != (nk_uint *)0x0) {
      *y_offset = *local_48;
    }
  }
  return;
}

Assistant:

NK_API void
nk_group_get_scroll(struct nk_context *ctx, const char *id, nk_uint *x_offset, nk_uint *y_offset)
{
    int id_len;
    nk_hash id_hash;
    struct nk_window *win;
    nk_uint *x_offset_ptr;
    nk_uint *y_offset_ptr;

    NK_ASSERT(ctx);
    NK_ASSERT(id);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !id)
        return;

    /* find persistent group scrollbar value */
    win = ctx->current;
    id_len = (int)nk_strlen(id);
    id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
    x_offset_ptr = nk_find_value(win, id_hash);
    if (!x_offset_ptr) {
        x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
        y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

        NK_ASSERT(x_offset_ptr);
        NK_ASSERT(y_offset_ptr);
        if (!x_offset_ptr || !y_offset_ptr) return;
        *x_offset_ptr = *y_offset_ptr = 0;
    } else y_offset_ptr = nk_find_value(win, id_hash+1);
    if (x_offset)
      *x_offset = *x_offset_ptr;
    if (y_offset)
      *y_offset = *y_offset_ptr;
}